

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAcurv::NodeIntStateScatter
          (ChNodeFEAcurv *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  double *local_68;
  undefined8 local_60;
  ChState *local_50;
  ulong local_48;
  long local_38;
  
  local_48 = (ulong)off_x;
  local_68 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_48;
  local_38 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_60 = 3;
  local_50 = x;
  if ((long)local_48 <= local_38 + -3) {
    ChVector<double>::operator=
              ((ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_68);
    local_48 = (ulong)(off_x + 3);
    local_38 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_68 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_48;
    local_60 = 3;
    local_50 = x;
    if ((long)local_48 <= local_38 + -3) {
      ChVector<double>::operator=
                (&this->m_ryy,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68);
      local_48 = (ulong)(off_x + 6);
      local_38 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_68 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_48;
      local_60 = 3;
      local_50 = x;
      if ((long)local_48 <= local_38 + -3) {
        ChVector<double>::operator=
                  (&this->m_rzz,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_68);
        local_48 = (ulong)off_v;
        local_68 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   local_48;
        local_38 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_60 = 3;
        local_50 = (ChState *)v;
        if ((long)local_48 <= local_38 + -3) {
          ChVector<double>::operator=
                    (&this->m_rxx_dt,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_68);
          local_48 = (ulong)(off_v + 3);
          local_38 = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
          local_68 = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + local_48;
          local_60 = 3;
          local_50 = (ChState *)v;
          if ((long)local_48 <= local_38 + -3) {
            ChVector<double>::operator=
                      (&this->m_ryy_dt,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_68);
            local_48 = (ulong)(off_v + 6);
            local_38 = (v->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            local_68 = (v->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + local_48;
            local_60 = 3;
            local_50 = (ChState *)v;
            if ((long)local_48 <= local_38 + -3) {
              ChVector<double>::operator=
                        (&this->m_rzz_dt,
                         (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_68);
              return;
            }
          }
        }
      }
    }
  }
  local_60 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::NodeIntStateScatter(const unsigned int off_x,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const double T) {
    m_rxx = x.segment(off_x + 0, 3);
    m_ryy = x.segment(off_x + 3, 3);
    m_rzz = x.segment(off_x + 6, 3);

    m_rxx_dt = v.segment(off_v + 0, 3);
    m_ryy_dt = v.segment(off_v + 3, 3);
    m_rzz_dt = v.segment(off_v + 6, 3);
}